

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic_logger.cpp
# Opt level: O1

void __thiscall
BasicLoggerTimeFixture_ArbitraryPointInTime_Test::TestBody
          (BasicLoggerTimeFixture_ArbitraryPointInTime_Test *this)

{
  array<char,_25UL> *rhs;
  char *pcVar1;
  AssertionResult gtest_ar;
  size_t r;
  time_zone_setter tzs;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  span<char,_25L> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  AssertHelper local_48;
  size_t local_40;
  time_zone_setter local_38;
  
  anon_unknown.dwarf_3e3aa::time_zone_setter::time_zone_setter(&local_38,"UTC0");
  rhs = &(this->super_BasicLoggerTimeFixture).buffer_;
  local_58.storage_.data_ =
       (storage_type<pstore::gsl::details::extent_type<25L>_>)
       (storage_type<pstore::gsl::details::extent_type<25L>_>)rhs;
  local_40 = pstore::basic_logger::time_string(0x5641868c,&local_58);
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_58,"std::size_t{24}","r",(unsigned_long *)&local_60,&local_40);
  if (local_58.storage_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_basic_logger.cpp"
               ,0xb7,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  anon_unknown.dwarf_3e3aa::BasicLoggerTimeFixture::canonicalize_sign
            (&this->super_BasicLoggerTimeFixture);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_58,"\"2015-11-10T05:54:20-0000\"","buffer_.data ()",
             "2015-11-10T05:54:20-0000",rhs->_M_elems);
  if (local_58.storage_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_basic_logger.cpp"
               ,0xb9,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  anon_unknown.dwarf_3e3aa::time_zone_setter::~time_zone_setter(&local_38);
  return;
}

Assistant:

TEST_F (BasicLoggerTimeFixture, ArbitraryPointInTime) {
    time_zone_setter tzs ("UTC0");
    std::time_t const time{1447134860};
    std::size_t const r =
        pstore::basic_logger::time_string (time, pstore::gsl::make_span (buffer_));
    EXPECT_EQ (std::size_t{24}, r);
    this->canonicalize_sign ();
    EXPECT_STREQ ("2015-11-10T05:54:20-0000", buffer_.data ());
}